

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void GenStartAndEnd(Map *map,Point *start,Point *end)

{
  bool bVar1;
  uint32_t h;
  uint32_t w;
  int iVar2;
  Point local_2c;
  Point point;
  uint32_t i;
  Point *end_local;
  Point *start_local;
  Map *map_local;
  
  unique0x100000aa = end;
  bVar1 = astar::Map::Empty(map);
  if (!bVar1) {
    point.x = 0;
    while ((uint)point.x < 2) {
      h = astar::Map::Height(map);
      w = astar::Map::Width(map);
      local_2c = MapRandPoint(h,w);
      iVar2 = astar::Map::At(map,&local_2c);
      if (iVar2 == 0) {
        if (point.x == 0) {
          astar::Map::Assign(map,&local_2c,2);
          *start = local_2c;
        }
        else {
          astar::Map::Assign(map,&local_2c,3);
          *stack0xffffffffffffffe0 = local_2c;
        }
        point.x = point.x + 1;
      }
    }
  }
  return;
}

Assistant:

void GenStartAndEnd(Map& map, Point& start, Point& end)
{
    if (map.Empty()) {
        return;
    }
    for (uint32_t i = 0; i < 2;) {
        auto point = MapRandPoint(map.Height(), map.Width());
        if (map.At(point) == 0) {
            if (i == 0) {
                map.Assign(point, 2);
                start = point;
            }
            else {
                map.Assign(point, 3);
                end = point;
            }
            i++;
        }
        else {
            continue;
        }
    }
}